

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

NULLCRef * NULLCVector::VectorBack(NULLCRef *__return_storage_ptr__,vector *vec)

{
  char *local_30;
  uint local_24;
  vector *vec_local;
  
  memset(__return_storage_ptr__,0,0xc);
  if (vec->size == 0) {
    nullcThrowError("vector::back called on an empty vector");
  }
  else {
    if (vec->flags == 0) {
      local_24 = vec->elemType;
    }
    else {
      local_24 = nullcGetSubType(vec->elemType);
    }
    __return_storage_ptr__->typeID = local_24;
    if (vec->flags == 0) {
      local_30 = (vec->data).ptr + vec->elemSize * (vec->size - 1);
    }
    else {
      local_30 = *(char **)((vec->data).ptr + (ulong)(vec->size - 1) * 8);
    }
    __return_storage_ptr__->ptr = local_30;
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCRef VectorBack(vector* vec)
	{
		NULLCRef ret = { 0, 0 };
		if(!vec->size)
		{
			nullcThrowError("vector::back called on an empty vector");
			return ret;
		}
		ret.typeID = (vec->flags ? nullcGetSubType(vec->elemType) : vec->elemType);
		ret.ptr = vec->flags ? ((char**)vec->data.ptr)[vec->size - 1] : (vec->data.ptr + vec->elemSize * (vec->size - 1));
		return ret;
	}